

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O3

void build_tree(deflate_state *s,tree_desc *desc)

{
  short *psVar1;
  ushort uVar2;
  int iVar3;
  ct_data *tree;
  ct_data *pcVar4;
  static_tree_desc *psVar5;
  ct_data *pcVar6;
  intf *piVar7;
  bool bVar8;
  int iVar9;
  ushort uVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  intf iVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  ush *puVar26;
  int iVar27;
  ulong uVar28;
  ush next_code [16];
  ushort auStack_58 [20];
  
  tree = desc->dyn_tree;
  pcVar4 = desc->stat_desc->static_tree;
  uVar15 = (ulong)desc->stat_desc->elems;
  s->heap_len = 0;
  s->heap_max = 0x23d;
  uVar28 = 0xffffffff;
  if ((long)uVar15 < 1) {
    uVar22 = 0;
  }
  else {
    uVar14 = 0;
    do {
      if (tree[uVar14].fc.freq == 0) {
        tree[uVar14].dl.dad = 0;
      }
      else {
        iVar27 = s->heap_len;
        s->heap_len = iVar27 + 1;
        s->heap[(long)iVar27 + 1] = (int)uVar14;
        s->depth[uVar14] = '\0';
        uVar28 = uVar14 & 0xffffffff;
      }
      iVar27 = (int)uVar28;
      uVar14 = uVar14 + 1;
    } while (uVar15 != uVar14);
    uVar22 = s->heap_len;
    if (1 < (int)uVar22) goto LAB_0025b6d6;
  }
  do {
    iVar9 = (int)uVar28;
    uVar11 = iVar9 + 1;
    if (iVar9 < 2) {
      uVar28 = (ulong)uVar11;
    }
    iVar27 = (int)uVar28;
    if (1 < iVar9) {
      uVar11 = 0;
    }
    s->heap_len = uVar22 + 1;
    s->heap[(long)(int)uVar22 + 1] = uVar11;
    tree[(int)uVar11].fc.freq = 1;
    s->depth[(int)uVar11] = '\0';
    s->opt_len = s->opt_len - 1;
    if (pcVar4 != (ct_data *)0x0) {
      s->static_len = s->static_len - (ulong)pcVar4[(int)uVar11].dl.dad;
    }
    uVar22 = s->heap_len;
  } while ((int)uVar22 < 2);
LAB_0025b6d6:
  desc->max_code = iVar27;
  uVar22 = uVar22 >> 1;
  do {
    pqdownheap(s,tree,uVar22);
    bVar8 = 1 < uVar22;
    uVar22 = uVar22 - 1;
  } while (bVar8);
  iVar9 = s->heap_len;
  do {
    iVar19 = s->heap[1];
    s->heap_len = iVar9 + -1;
    s->heap[1] = s->heap[iVar9];
    pqdownheap(s,tree,1);
    iVar9 = s->heap[1];
    iVar3 = s->heap_max;
    s->heap_max = iVar3 + -1;
    s->heap[(long)iVar3 + -1] = iVar19;
    iVar3 = s->heap_max;
    s->heap_max = iVar3 + -1;
    s->heap[(long)iVar3 + -1] = iVar9;
    tree[uVar15].fc.freq = tree[iVar9].fc.freq + tree[iVar19].fc.freq;
    bVar12 = s->depth[iVar9];
    if (s->depth[iVar9] < s->depth[iVar19]) {
      bVar12 = s->depth[iVar19];
    }
    s->depth[uVar15] = bVar12 + 1;
    tree[iVar9].dl.dad = (ush)uVar15;
    tree[iVar19].dl.dad = (ush)uVar15;
    s->heap[1] = (int)uVar15;
    pqdownheap(s,tree,1);
    iVar9 = s->heap_len;
    uVar15 = uVar15 + 1;
  } while (1 < iVar9);
  iVar9 = s->heap[1];
  iVar19 = s->heap_max;
  s->heap_max = iVar19 + -1;
  s->heap[(long)iVar19 + -1] = iVar9;
  pcVar4 = desc->dyn_tree;
  iVar9 = desc->max_code;
  psVar5 = desc->stat_desc;
  pcVar6 = psVar5->static_tree;
  piVar7 = psVar5->extra_bits;
  iVar19 = psVar5->extra_base;
  iVar3 = psVar5->max_length;
  lVar23 = (long)iVar3;
  s->bl_count[8] = 0;
  s->bl_count[9] = 0;
  s->bl_count[10] = 0;
  s->bl_count[0xb] = 0;
  s->bl_count[0xc] = 0;
  s->bl_count[0xd] = 0;
  s->bl_count[0xe] = 0;
  s->bl_count[0xf] = 0;
  s->bl_count[0] = 0;
  s->bl_count[1] = 0;
  s->bl_count[2] = 0;
  s->bl_count[3] = 0;
  s->bl_count[4] = 0;
  s->bl_count[5] = 0;
  s->bl_count[6] = 0;
  s->bl_count[7] = 0;
  pcVar4[s->heap[s->heap_max]].dl.dad = 0;
  if ((long)s->heap_max < 0x23c) {
    iVar16 = 0;
    lVar25 = (long)s->heap_max;
    do {
      iVar24 = s->heap[lVar25 + 1];
      uVar10 = pcVar4[pcVar4[iVar24].dl.dad].dl.dad;
      iVar18 = iVar3;
      if ((int)(uint)uVar10 < iVar3) {
        iVar18 = uVar10 + 1;
      }
      pcVar4[iVar24].dl.dad = (ush)iVar18;
      if (iVar24 <= iVar9) {
        s->bl_count[iVar18] = s->bl_count[iVar18] + 1;
        iVar21 = 0;
        if (iVar19 <= iVar24) {
          iVar21 = piVar7[iVar24 - iVar19];
        }
        uVar2 = pcVar4[iVar24].fc.freq;
        s->opt_len = s->opt_len + (ulong)(uint)(iVar18 + iVar21) * (ulong)uVar2;
        if (pcVar6 != (ct_data *)0x0) {
          s->static_len =
               s->static_len + (ulong)(iVar21 + (uint)pcVar6[iVar24].dl.dad) * (ulong)uVar2;
        }
      }
      iVar16 = iVar16 + (uint)(iVar3 <= (int)(uint)uVar10);
      iVar24 = (int)lVar25;
      lVar25 = lVar25 + 1;
    } while (iVar24 != 0x23b);
    if (iVar16 != 0) {
      lVar20 = (lVar23 << 0x20) + 0x100000000;
      lVar25 = lVar20;
      puVar26 = s->bl_count + lVar23;
      do {
        do {
          lVar25 = lVar25 + -0x100000000;
          psVar1 = (short *)(puVar26 + -1);
          puVar26 = puVar26 + -1;
        } while (*psVar1 == 0);
        *puVar26 = *psVar1 - 1;
        psVar1 = (short *)((long)s->bl_count + (lVar25 >> 0x1f));
        *psVar1 = *psVar1 + 2;
        s->bl_count[lVar23] = s->bl_count[lVar23] - 1;
        bVar8 = 2 < iVar16;
        lVar25 = lVar20;
        puVar26 = s->bl_count + lVar23;
        iVar16 = iVar16 + -2;
      } while (bVar8);
      if (iVar3 != 0) {
        iVar19 = 0x23d;
        do {
          uVar22 = (uint)s->bl_count[lVar23];
          if (s->bl_count[lVar23] != 0) {
            do {
              puVar26 = (ush *)(s->heap + (long)iVar19 + -1);
              do {
                iVar3 = *(int *)puVar26;
                iVar19 = iVar19 + -1;
                puVar26 = puVar26 + -2;
              } while (iVar9 < iVar3);
              lVar25 = lVar23 - (ulong)pcVar4[iVar3].dl.dad;
              if (lVar25 != 0) {
                s->opt_len = s->opt_len + lVar25 * (ulong)pcVar4[iVar3].fc.freq;
                pcVar4[iVar3].dl.dad = (ush)lVar23;
              }
              uVar22 = uVar22 - 1;
            } while (uVar22 != 0);
          }
          lVar23 = lVar23 + -1;
        } while (lVar23 != 0);
      }
    }
  }
  lVar23 = 0;
  uVar10 = 0;
  do {
    uVar10 = (uVar10 + s->bl_count[lVar23]) * 2;
    auStack_58[lVar23 + 1] = uVar10;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 0xf);
  if (-1 < iVar27) {
    uVar15 = 0;
    do {
      if (tree[uVar15].dl.dad != 0) {
        uVar11 = (uint)tree[uVar15].dl.dad;
        uVar13 = (uint)auStack_58[uVar11];
        auStack_58[uVar11] = auStack_58[uVar11] + 1;
        uVar11 = uVar11 + 1;
        uVar22 = 0;
        do {
          uVar17 = uVar22 | uVar13 & 1;
          uVar13 = uVar13 >> 1;
          uVar22 = uVar17 * 2;
          uVar11 = uVar11 - 1;
        } while (1 < uVar11);
        tree[uVar15].fc.freq = (ush)uVar17;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != iVar27 + 1);
  }
  return;
}

Assistant:

local void build_tree(s, desc)
    deflate_state *s;
    tree_desc *desc; /* the tree descriptor */
{
    ct_data *tree         = desc->dyn_tree;
    const ct_data *stree  = desc->stat_desc->static_tree;
    int elems             = desc->stat_desc->elems;
    int n, m;          /* iterate over heap elements */
    int max_code = -1; /* largest code with non zero frequency */
    int node;          /* new node being created */

    /* Construct the initial heap, with least frequent element in
     * heap[SMALLEST]. The sons of heap[n] are heap[2*n] and heap[2*n+1].
     * heap[0] is not used.
     */
    s->heap_len = 0, s->heap_max = HEAP_SIZE;

    for (n = 0; n < elems; n++) {
        if (tree[n].Freq != 0) {
            s->heap[++(s->heap_len)] = max_code = n;
            s->depth[n] = 0;
        } else {
            tree[n].Len = 0;
        }
    }

    /* The pkzip format requires that at least one distance code exists,
     * and that at least one bit should be sent even if there is only one
     * possible code. So to avoid special checks later on we force at least
     * two codes of non zero frequency.
     */
    while (s->heap_len < 2) {
        node = s->heap[++(s->heap_len)] = (max_code < 2 ? ++max_code : 0);
        tree[node].Freq = 1;
        s->depth[node] = 0;
        s->opt_len--; if (stree) s->static_len -= stree[node].Len;
        /* node is 0 or 1 so it does not have extra bits */
    }
    desc->max_code = max_code;

    /* The elements heap[heap_len/2+1 .. heap_len] are leaves of the tree,
     * establish sub-heaps of increasing lengths:
     */
    for (n = s->heap_len/2; n >= 1; n--) pqdownheap(s, tree, n);

    /* Construct the Huffman tree by repeatedly combining the least two
     * frequent nodes.
     */
    node = elems;              /* next internal node of the tree */
    do {
        pqremove(s, tree, n);  /* n = node of least frequency */
        m = s->heap[SMALLEST]; /* m = node of next least frequency */

        s->heap[--(s->heap_max)] = n; /* keep the nodes sorted by frequency */
        s->heap[--(s->heap_max)] = m;

        /* Create a new node father of n and m */
        tree[node].Freq = tree[n].Freq + tree[m].Freq;
        s->depth[node] = (uch)((s->depth[n] >= s->depth[m] ?
                                s->depth[n] : s->depth[m]) + 1);
        tree[n].Dad = tree[m].Dad = (ush)node;
#ifdef DUMP_BL_TREE
        if (tree == s->bl_tree) {
            fprintf(stderr,"\nnode %d(%d), sons %d(%d) %d(%d)",
                    node, tree[node].Freq, n, tree[n].Freq, m, tree[m].Freq);
        }
#endif
        /* and insert the new node in the heap */
        s->heap[SMALLEST] = node++;
        pqdownheap(s, tree, SMALLEST);

    } while (s->heap_len >= 2);

    s->heap[--(s->heap_max)] = s->heap[SMALLEST];

    /* At this point, the fields freq and dad are set. We can now
     * generate the bit lengths.
     */
    gen_bitlen(s, (tree_desc *)desc);

    /* The field len is now set, we can generate the bit codes */
    gen_codes ((ct_data *)tree, max_code, s->bl_count);
}